

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_tiled_argb(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_48_8_3fbc74da local_118;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      blend_tiled_generic(count,spans,userData);
      return;
    }
    goto LAB_005aa3f4;
  }
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,spans,count);
  local_118.image_width = *(int *)((long)userData + 0xb0);
  local_118.image_height = *(int *)((long)userData + 0xb4);
  iVar6 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                        0x3fe0000000000000) - *(double *)((long)userData + 0x70)) %
          local_118.image_width;
  iVar7 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                        0x3fe0000000000000) - *(double *)((long)userData + 0x78)) %
          local_118.image_height;
  local_118.xoff = 0;
  if (0 < iVar6) {
    local_118.xoff = local_118.image_width;
  }
  local_118.xoff = local_118.xoff - iVar6;
  local_118.yoff = 0;
  if (0 < iVar7) {
    local_118.yoff = local_118.image_height;
  }
  local_118.yoff = local_118.yoff - iVar7;
  local_118._28_4_ = 0xaaaaaaaa;
  local_118.const_alpha = *(int *)((long)userData + 0xe8);
  local_118.func = op.func;
  uVar8 = (long)(count + 0x20) / 0x40 & 0xffffffff;
  local_118.spans = spans;
  local_118.data = (QSpanData *)userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((count < 0x60) || (pQVar3 == (QThreadPool *)0x0)) ||
     ((int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp < 3)) {
LAB_005aa2d5:
    blend_tiled_argb::anon_class_48_8_3fbc74da::operator()(&local_118,0,count);
  }
  else {
    QThread::currentThread();
    cVar2 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar2 != '\0') goto LAB_005aa2d5;
    _semaphore = &DAT_aaaaaaaaaaaaaaaa;
    iVar6 = 0;
    QSemaphore::QSemaphore(&semaphore,0);
    while( true ) {
      iVar7 = (int)uVar8;
      uVar8 = (ulong)(iVar7 - 1);
      if (iVar7 == 0) break;
      iVar7 = (count - iVar6) / iVar7;
      puVar4 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar4 + 1) = 1;
      *puVar4 = QFactoryLoader::keyMap;
      puVar5 = (undefined8 *)operator_new(0x20);
      *puVar5 = QRunnable::QGenericRunnable::
                Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
                ::impl;
      *(int *)(puVar5 + 1) = iVar6;
      *(int *)((long)puVar5 + 0xc) = iVar7;
      puVar5[2] = &local_118;
      puVar5[3] = &semaphore;
      puVar4[2] = puVar5;
      QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
      iVar6 = iVar6 + iVar7;
    }
    QSemaphore::acquire((int)&semaphore);
    QSemaphore::~QSemaphore(&semaphore);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005aa3f4:
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_tiled_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;
    const auto func = op.func;
    const int const_alpha = data->texture.const_alpha;

    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                func(dest, src, l, coverage);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}